

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::ResetEntryPoint(FunctionBody *this)

{
  ScriptFunctionType *pSVar1;
  ProxyEntryPointInfo *pPVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  FunctionInfo *this_00;
  
  ClearEntryPoints(this);
  CreateNewDefaultEntryPoint(this);
  this_00 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (this_00 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4e3,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_0076af41;
    *puVar5 = 0;
    this_00 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  if ((FunctionBody *)(this_00->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4e4,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar4) {
LAB_0076af41:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
    this_00 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  FunctionInfo::SetOriginalEntryPoint(this_00,InterpreterStackFrame::DelayDynamicInterpreterThunk);
  ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr)->jsMethod =
       (Type)((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->CurrentThunk
  ;
  pSVar1 = (this->super_ParseableFunctionInfo).super_FunctionProxy.deferredPrototypeType.ptr;
  if (pSVar1 != (ScriptFunctionType *)0x0) {
    (pSVar1->super_DynamicType).super_Type.entryPoint =
         ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr)->
         jsMethod;
    pPVar2 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr;
    Memory::Recycler::WBSetBit((char *)&pSVar1->entryPointInfo);
    (pSVar1->entryPointInfo).ptr = pPVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&pSVar1->entryPointInfo);
  }
  pSVar1 = (this->super_ParseableFunctionInfo).super_FunctionProxy.undeferredFunctionType.ptr;
  if (pSVar1 != (ScriptFunctionType *)0x0) {
    (pSVar1->super_DynamicType).super_Type.entryPoint =
         ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr)->
         jsMethod;
    pPVar2 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr;
    Memory::Recycler::WBSetBit((char *)&pSVar1->entryPointInfo);
    (pSVar1->entryPointInfo).ptr = pPVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&pSVar1->entryPointInfo);
  }
  pSVar1 = (this->super_ParseableFunctionInfo).crossSiteDeferredFunctionType.ptr;
  if (pSVar1 != (ScriptFunctionType *)0x0) {
    pPVar2 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr;
    Memory::Recycler::WBSetBit((char *)&pSVar1->entryPointInfo);
    (pSVar1->entryPointInfo).ptr = pPVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&pSVar1->entryPointInfo);
  }
  pSVar1 = (this->super_ParseableFunctionInfo).crossSiteUndeferredFunctionType.ptr;
  if (pSVar1 != (ScriptFunctionType *)0x0) {
    pPVar2 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr;
    Memory::Recycler::WBSetBit((char *)&pSVar1->entryPointInfo);
    (pSVar1->entryPointInfo).ptr = pPVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&pSVar1->entryPointInfo);
  }
  this->field_0x179 = this->field_0x179 & 0x7f;
  FunctionExecutionStateMachine::ReinitializeExecutionModeAndLimits(&this->executionState,this);
  return;
}

Assistant:

void FunctionBody::ResetEntryPoint()
    {
        ClearEntryPoints();
        this->CreateNewDefaultEntryPoint();
        this->SetOriginalEntryPoint(DefaultEntryThunk);
        m_defaultEntryPointInfo->jsMethod = m_scriptContext->CurrentThunk;

        if (this->deferredPrototypeType)
        {
            // Update old entry points on the deferred prototype type,
            // as they may point to old native code gen regions which are gone now.
            this->deferredPrototypeType->SetEntryPoint(this->GetDefaultEntryPointInfo()->jsMethod);
            this->deferredPrototypeType->SetEntryPointInfo(this->GetDefaultEntryPointInfo());
        }
        if (this->undeferredFunctionType)
        {
            this->undeferredFunctionType->SetEntryPoint(this->GetDefaultEntryPointInfo()->jsMethod);
            this->undeferredFunctionType->SetEntryPointInfo(this->GetDefaultEntryPointInfo());
        }
        if (this->crossSiteDeferredFunctionType)
        {
            this->crossSiteDeferredFunctionType->SetEntryPointInfo(this->GetDefaultEntryPointInfo());
        }
        if (this->crossSiteUndeferredFunctionType)
        {
            this->crossSiteUndeferredFunctionType->SetEntryPointInfo(this->GetDefaultEntryPointInfo());
        }
        ReinitializeExecutionModeAndLimits();
    }